

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int size;
  uint uVar2;
  char *data;
  string *value;
  EnumValueDescriptorProto *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_48;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  EnumDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.EnumDescriptorProto.name");
    value = name_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(1,value,target);
  }
  local_48 = 0;
  uVar2 = value_size(this);
  for (; local_48 < uVar2; local_48 = local_48 + 1) {
    value_00 = EnumDescriptorProto::value(this,local_48);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::EnumValueDescriptorProto>
                   (2,value_00,deterministic,_i);
  }
  if ((uVar1 & 2) != 0) {
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::EnumOptions>
                   (3,this->options_,deterministic,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = EnumDescriptorProto::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0, n = this->value_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->value(i), deterministic, target);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}